

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeDeviceCanAccessPeerPrologue
          (ZEParameterValidation *this,ze_device_handle_t hDevice,ze_device_handle_t hPeerDevice,
          ze_bool_t *value)

{
  ze_result_t zVar1;
  
  zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  if (value != (ze_bool_t *)0x0) {
    zVar1 = ZE_RESULT_SUCCESS;
  }
  if (hPeerDevice == (ze_device_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  if (hDevice == (ze_device_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  return zVar1;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeDeviceCanAccessPeerPrologue(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device performing the access
        ze_device_handle_t hPeerDevice,                 ///< [in] handle of the peer device with the allocation
        ze_bool_t* value                                ///< [out] returned access capability
        )
    {
        if( nullptr == hDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == hPeerDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == value )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ZE_RESULT_SUCCESS;
    }